

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O0

void MWT::print_scalars(int f,v_array<float> *scalars,v_array<char> *tag)

{
  ulong uVar1;
  size_t sVar2;
  float *pfVar3;
  char *pcVar4;
  long lVar5;
  ssize_t sVar6;
  ostream *poVar7;
  int *piVar8;
  v_array<char> *in_RDX;
  v_array<float> *in_RSI;
  int in_EDI;
  ssize_t t;
  ssize_t len;
  size_t i_1;
  size_t i;
  stringstream ss;
  void *in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd80;
  int f_00;
  string local_210 [32];
  ssize_t local_1f0;
  string local_1e8 [32];
  long local_1c8;
  ulong local_1c0;
  ulong local_1a8;
  stringstream local_1a0 [16];
  ostream local_190;
  v_array<char> *local_18;
  v_array<float> *local_10;
  
  if (-1 < in_EDI) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    std::__cxx11::stringstream::stringstream(local_1a0);
    local_1a8 = 0;
    while( true ) {
      uVar1 = local_1a8;
      sVar2 = v_array<float>::size(local_10);
      if (sVar2 <= uVar1) break;
      if (local_1a8 != 0) {
        std::operator<<(&local_190,' ');
      }
      pfVar3 = v_array<float>::operator[](local_10,local_1a8);
      std::ostream::operator<<(&local_190,*pfVar3);
      local_1a8 = local_1a8 + 1;
    }
    local_1c0 = 0;
    while( true ) {
      uVar1 = local_1c0;
      sVar2 = v_array<char>::size(local_18);
      f_00 = (int)((ulong)in_stack_fffffffffffffd80 >> 0x20);
      if (sVar2 <= uVar1) break;
      if (local_1c0 == 0) {
        std::operator<<(&local_190,' ');
      }
      pcVar4 = v_array<char>::operator[](local_18,local_1c0);
      std::operator<<(&local_190,*pcVar4);
      local_1c0 = local_1c0 + 1;
    }
    std::operator<<(&local_190,'\n');
    std::__cxx11::stringstream::str();
    lVar5 = std::__cxx11::string::size();
    std::__cxx11::string::~string(local_1e8);
    local_1c8 = lVar5;
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    sVar6 = io_buf::write_file_or_socket(f_00,in_stack_fffffffffffffd78,0x211018);
    std::__cxx11::string::~string(local_210);
    local_1f0 = sVar6;
    if (sVar6 != local_1c8) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"write error: ");
      piVar8 = __errno_location();
      pcVar4 = strerror(*piVar8);
      poVar7 = std::operator<<(poVar7,pcVar4);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  return;
}

Assistant:

void print_scalars(int f, v_array<float>& scalars, v_array<char>& tag)
{
  if (f >= 0)
  {
    std::stringstream ss;

    for (size_t i = 0; i < scalars.size(); i++)
    {
      if (i > 0)
        ss << ' ';
      ss << scalars[i];
    }
    for (size_t i = 0; i < tag.size(); i++)
    {
      if (i == 0)
        ss << ' ';
      ss << tag[i];
    }
    ss << '\n';
    ssize_t len = ss.str().size();
    ssize_t t = io_buf::write_file_or_socket(f, ss.str().c_str(), (unsigned int)len);
    if (t != len)
      cerr << "write error: " << strerror(errno) << endl;
  }
}